

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

vector<duckdb::PartitionStatistics,_true> *
duckdb::TableScanGetPartitionStats
          (vector<duckdb::PartitionStatistics,_true> *__return_storage_ptr__,ClientContext *context,
          GetPartitionStatsInput *input)

{
  DataTable *this;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  this = (DataTable *)(**(code **)(*(input->bind_data).ptr[4]._vptr_FunctionData + 0x80))();
  DataTable::GetPartitionStats(__return_storage_ptr__,this,context);
  return __return_storage_ptr__;
}

Assistant:

vector<PartitionStatistics> TableScanGetPartitionStats(ClientContext &context, GetPartitionStatsInput &input) {
	auto &bind_data = input.bind_data->Cast<TableScanBindData>();
	vector<PartitionStatistics> result;
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	auto &storage = duck_table.GetStorage();
	return storage.GetPartitionStats(context);
}